

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::HttpEntityBodyReader::doneReading(HttpEntityBodyReader *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  HttpInputStreamImpl *pHVar3;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pHVar3 = getInner(this);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
            (&pHVar3->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
             &this->weakInner);
  this->finished = true;
  pPVar1 = (pHVar3->onMessageDone).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    pDVar2 = (pHVar3->onMessageDone).ptr.disposer;
    pPVar1 = (pHVar3->onMessageDone).ptr.ptr;
    (pHVar3->onMessageDone).ptr.disposer = (Disposer *)0x0;
    (pHVar3->onMessageDone).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
    pHVar3->pendingMessageCount = pHVar3->pendingMessageCount - 1;
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void doneReading() {
    auto& inner = getInner();
    inner.unsetCurrentWrapper(weakInner);
    finished = true;
    inner.finishRead();
  }